

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::detail::split(char *b,char *e,char d,function<void_(const_char_*,_const_char_*)> *fn)

{
  bool bVar1;
  pair<unsigned_long,_unsigned_long> pVar2;
  ulong local_58;
  pair<unsigned_long,_unsigned_long> r_1;
  pair<unsigned_long,_unsigned_long> r;
  size_t beg;
  size_t i;
  function<void_(const_char_*,_const_char_*)> *fn_local;
  char d_local;
  char *e_local;
  char *b_local;
  
  beg = 0;
  r.second = 0;
  while( true ) {
    if (e == (char *)0x0) {
      bVar1 = b[beg] != '\0';
    }
    else {
      bVar1 = b + beg < e;
    }
    if (!bVar1) break;
    if (b[beg] == d) {
      pVar2 = trim(b,e,r.second,beg);
      r_1.second = pVar2.first;
      r.first = pVar2.second;
      if (r_1.second < r.first) {
        std::function<void_(const_char_*,_const_char_*)>::operator()(fn,b + r_1.second,b + r.first);
      }
      r.second = beg + 1;
    }
    beg = beg + 1;
  }
  if (beg != 0) {
    pVar2 = trim(b,e,r.second,beg);
    local_58 = pVar2.first;
    r_1.first = pVar2.second;
    if (local_58 < r_1.first) {
      std::function<void_(const_char_*,_const_char_*)>::operator()(fn,b + local_58,b + r_1.first);
    }
  }
  return;
}

Assistant:

inline void split(const char *b, const char *e, char d,
                  std::function<void(const char *, const char *)> fn) {
  size_t i = 0;
  size_t beg = 0;

  while (e ? (b + i < e) : (b[i] != '\0')) {
    if (b[i] == d) {
      auto r = trim(b, e, beg, i);
      if (r.first < r.second) { fn(&b[r.first], &b[r.second]); }
      beg = i + 1;
    }
    i++;
  }

  if (i) {
    auto r = trim(b, e, beg, i);
    if (r.first < r.second) { fn(&b[r.first], &b[r.second]); }
  }
}